

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void do_ssi_exec(mg_connection *nc,char *tag)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  char cmd [8192];
  char acStack_2018 [8200];
  
  iVar1 = __isoc99_sscanf(tag," \"%[^\"]\"",acStack_2018);
  if (iVar1 == 1) {
    __stream = popen(acStack_2018,"r");
    if (__stream == (FILE *)0x0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      mg_printf(nc,"Cannot SSI #exec: [%s]: %s",acStack_2018,pcVar3);
    }
    else {
      send_file_data(nc,(FILE *)__stream);
      pclose(__stream);
    }
  }
  else {
    mg_printf(nc,"Bad SSI #exec: [%s]",tag);
  }
  return;
}

Assistant:

static void do_ssi_exec(struct mg_connection *nc, char *tag) {
    char cmd[BUFSIZ];
    FILE *fp;

    if (sscanf(tag, " \"%[^\"]\"", cmd) != 1) {
        mg_printf(nc, "Bad SSI #exec: [%s]", tag);
    } else if ((fp = popen(cmd, "r")) == NULL) {
        mg_printf(nc, "Cannot SSI #exec: [%s]: %s", cmd, strerror(errno));
    } else {
        send_file_data(nc, fp);
        pclose(fp);
    }
}